

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createMaterial_substrate(SemanticParser *this,SP *in)

{
  bool bVar1;
  element_type *peVar2;
  runtime_error *this_00;
  SP *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_RSI;
  element_type *in_RDI;
  SP SVar3;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *__range1;
  SP mat;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe04;
  undefined1 in_stack_fffffffffffffe05;
  byte in_stack_fffffffffffffe06;
  undefined1 in_stack_fffffffffffffe07;
  float in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe0c;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 in_stack_fffffffffffffe0f;
  float in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe14;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  string local_180 [28];
  float in_stack_fffffffffffffe9c;
  string *in_stack_fffffffffffffea0;
  ParamSet *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffed8;
  float *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  string *in_stack_fffffffffffffef0;
  ParamSet *in_stack_fffffffffffffef8;
  vec3f local_dc [4];
  vec3f local_ac;
  string local_a0 [48];
  string local_70 [48];
  _Self local_40;
  _Self local_38;
  element_type *local_30;
  
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1b3d0b);
  std::make_shared<pbrt::SubstrateMaterial,std::__cxx11::string&>(in_stack_fffffffffffffe28);
  local_30 = std::
             __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b3d29);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                *)in_stack_fffffffffffffdf8);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
              *)in_stack_fffffffffffffdf8);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      std::shared_ptr<pbrt::Material>::shared_ptr<pbrt::SubstrateMaterial,void>
                ((shared_ptr<pbrt::Material> *)
                 CONCAT17(in_stack_fffffffffffffe07,
                          CONCAT16(in_stack_fffffffffffffe06,
                                   CONCAT15(in_stack_fffffffffffffe05,
                                            CONCAT14(in_stack_fffffffffffffe04,
                                                     in_stack_fffffffffffffe00)))),
                 (shared_ptr<pbrt::SubstrateMaterial> *)in_stack_fffffffffffffdf8);
      std::shared_ptr<pbrt::SubstrateMaterial>::~shared_ptr
                ((shared_ptr<pbrt::SubstrateMaterial> *)0x1b4637);
      SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (SP)SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                 *)0x1b3d86);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
            *)CONCAT17(in_stack_fffffffffffffe07,
                       CONCAT16(in_stack_fffffffffffffe06,
                                CONCAT15(in_stack_fffffffffffffe05,
                                         CONCAT14(in_stack_fffffffffffffe04,
                                                  in_stack_fffffffffffffe00)))),
           in_stack_fffffffffffffdf8);
    std::__cxx11::string::string(local_a0,local_70);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe07,
                                     CONCAT16(in_stack_fffffffffffffe06,
                                              CONCAT15(in_stack_fffffffffffffe05,
                                                       CONCAT14(in_stack_fffffffffffffe04,
                                                                in_stack_fffffffffffffe00)))),
                            (char *)in_stack_fffffffffffffdf8);
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3de0);
      bVar1 = syntactic::ParamSet::hasParamTexture
                        ((ParamSet *)
                         CONCAT17(in_stack_fffffffffffffe17,
                                  CONCAT16(in_stack_fffffffffffffe16,
                                           CONCAT24(in_stack_fffffffffffffe14,
                                                    in_stack_fffffffffffffe10))),
                         (string *)
                         CONCAT17(in_stack_fffffffffffffe0f,
                                  CONCAT16(in_stack_fffffffffffffe0e,
                                           CONCAT24(in_stack_fffffffffffffe0c,
                                                    in_stack_fffffffffffffe08))));
      if (bVar1) {
        math::vec3f::vec3f(&local_ac,1.0);
        peVar2 = std::
                 __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b3e27);
        (peVar2->kd).z = local_ac.z;
        (peVar2->kd).x = local_ac.x;
        (peVar2->kd).y = local_ac.y;
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3e47);
        syntactic::ParamSet::getParamTexture(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        findOrCreateTexture((SemanticParser *)
                            CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),in_RDX);
        std::__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b3e8a);
        std::shared_ptr<pbrt::Texture>::operator=
                  ((shared_ptr<pbrt::Texture> *)
                   CONCAT17(in_stack_fffffffffffffe07,
                            CONCAT16(in_stack_fffffffffffffe06,
                                     CONCAT15(in_stack_fffffffffffffe05,
                                              CONCAT14(in_stack_fffffffffffffe04,
                                                       in_stack_fffffffffffffe00)))),
                   (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffdf8);
        std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b3eab);
        std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                  ((shared_ptr<pbrt::syntactic::Texture> *)0x1b3eb8);
      }
      else {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3f38);
        std::__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b3f4a);
        syntactic::ParamSet::getParam3f
                  ((ParamSet *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                   in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffe07,
                                       CONCAT16(in_stack_fffffffffffffe06,
                                                CONCAT15(in_stack_fffffffffffffe05,
                                                         CONCAT14(in_stack_fffffffffffffe04,
                                                                  in_stack_fffffffffffffe00)))),
                              (char *)in_stack_fffffffffffffdf8);
      if (bVar1) {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b3f9d);
        bVar1 = syntactic::ParamSet::hasParamTexture
                          ((ParamSet *)
                           CONCAT17(in_stack_fffffffffffffe17,
                                    CONCAT16(in_stack_fffffffffffffe16,
                                             CONCAT24(in_stack_fffffffffffffe14,
                                                      in_stack_fffffffffffffe10))),
                           (string *)
                           CONCAT17(in_stack_fffffffffffffe0f,
                                    CONCAT16(in_stack_fffffffffffffe0e,
                                             CONCAT24(in_stack_fffffffffffffe0c,
                                                      in_stack_fffffffffffffe08))));
        if (bVar1) {
          math::vec3f::vec3f(local_dc,1.0);
          peVar2 = std::
                   __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1b3fe4);
          (peVar2->ks).z = local_dc[0].z;
          (peVar2->ks).x = local_dc[0].x;
          (peVar2->ks).y = local_dc[0].y;
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b400a);
          syntactic::ParamSet::getParamTexture(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          findOrCreateTexture((SemanticParser *)
                              CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),in_RDX);
          std::
          __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b404d);
          std::shared_ptr<pbrt::Texture>::operator=
                    ((shared_ptr<pbrt::Texture> *)
                     CONCAT17(in_stack_fffffffffffffe07,
                              CONCAT16(in_stack_fffffffffffffe06,
                                       CONCAT15(in_stack_fffffffffffffe05,
                                                CONCAT14(in_stack_fffffffffffffe04,
                                                         in_stack_fffffffffffffe00)))),
                     (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffdf8);
          std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b4071);
          std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                    ((shared_ptr<pbrt::syntactic::Texture> *)0x1b407e);
        }
        else {
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b40b0);
          std::
          __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b40c2);
          syntactic::ParamSet::getParam3f
                    ((ParamSet *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        }
      }
      else {
        in_stack_fffffffffffffe17 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffe07,
                                      CONCAT16(in_stack_fffffffffffffe06,
                                               CONCAT15(in_stack_fffffffffffffe05,
                                                        CONCAT14(in_stack_fffffffffffffe04,
                                                                 in_stack_fffffffffffffe00)))),
                             (char *)in_stack_fffffffffffffdf8);
        if ((bool)in_stack_fffffffffffffe17) {
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b4118);
          in_stack_fffffffffffffe16 =
               syntactic::ParamSet::hasParamTexture
                         ((ParamSet *)
                          CONCAT17(in_stack_fffffffffffffe17,
                                   CONCAT16(in_stack_fffffffffffffe16,
                                            CONCAT24(in_stack_fffffffffffffe14,
                                                     in_stack_fffffffffffffe10))),
                          (string *)
                          CONCAT17(in_stack_fffffffffffffe0f,
                                   CONCAT16(in_stack_fffffffffffffe0e,
                                            CONCAT24(in_stack_fffffffffffffe0c,
                                                     in_stack_fffffffffffffe08))));
          if ((bool)in_stack_fffffffffffffe16) {
            peVar2 = std::
                     __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1b4148);
            peVar2->uRoughness = 1.0;
            std::
            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b4159);
            syntactic::ParamSet::getParamTexture
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
            findOrCreateTexture((SemanticParser *)
                                CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),in_RDX
                               );
            std::
            __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1b419c);
            std::shared_ptr<pbrt::Texture>::operator=
                      ((shared_ptr<pbrt::Texture> *)
                       CONCAT17(in_stack_fffffffffffffe07,
                                CONCAT16(in_stack_fffffffffffffe06,
                                         CONCAT15(in_stack_fffffffffffffe05,
                                                  CONCAT14(in_stack_fffffffffffffe04,
                                                           in_stack_fffffffffffffe00)))),
                       (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffdf8);
            std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b41bd);
            std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                      ((shared_ptr<pbrt::syntactic::Texture> *)0x1b41ca);
          }
          else {
            std::
            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b41fc);
            in_stack_fffffffffffffe10 =
                 syntactic::ParamSet::getParam1f
                           (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                            in_stack_fffffffffffffe9c);
            peVar2 = std::
                     __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1b4224);
            peVar2->uRoughness = in_stack_fffffffffffffe10;
          }
        }
        else {
          in_stack_fffffffffffffe0f =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffe07,
                                        CONCAT16(in_stack_fffffffffffffe06,
                                                 CONCAT15(in_stack_fffffffffffffe05,
                                                          CONCAT14(in_stack_fffffffffffffe04,
                                                                   in_stack_fffffffffffffe00)))),
                               (char *)in_stack_fffffffffffffdf8);
          if ((bool)in_stack_fffffffffffffe0f) {
            std::
            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b4265);
            in_stack_fffffffffffffe0e =
                 syntactic::ParamSet::hasParamTexture
                           ((ParamSet *)
                            CONCAT17(in_stack_fffffffffffffe17,
                                     CONCAT16(in_stack_fffffffffffffe16,
                                              CONCAT24(in_stack_fffffffffffffe14,
                                                       in_stack_fffffffffffffe10))),
                            (string *)
                            CONCAT17(in_stack_fffffffffffffe0f,
                                     CONCAT16(in_stack_fffffffffffffe0e,
                                              CONCAT24(in_stack_fffffffffffffe0c,
                                                       in_stack_fffffffffffffe08))));
            if ((bool)in_stack_fffffffffffffe0e) {
              peVar2 = std::
                       __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1b4295);
              peVar2->vRoughness = 1.0;
              std::
              __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b42a6);
              syntactic::ParamSet::getParamTexture
                        (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
              findOrCreateTexture((SemanticParser *)
                                  CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                                  in_RDX);
              std::
              __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b42e9);
              std::shared_ptr<pbrt::Texture>::operator=
                        ((shared_ptr<pbrt::Texture> *)
                         CONCAT17(in_stack_fffffffffffffe07,
                                  CONCAT16(in_stack_fffffffffffffe06,
                                           CONCAT15(in_stack_fffffffffffffe05,
                                                    CONCAT14(in_stack_fffffffffffffe04,
                                                             in_stack_fffffffffffffe00)))),
                         (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffdf8);
              std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b430a);
              std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                        ((shared_ptr<pbrt::syntactic::Texture> *)0x1b4317);
            }
            else {
              std::
              __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b4349);
              in_stack_fffffffffffffe08 =
                   syntactic::ParamSet::getParam1f
                             (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                              in_stack_fffffffffffffe9c);
              peVar2 = std::
                       __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1b4371);
              peVar2->vRoughness = in_stack_fffffffffffffe08;
            }
          }
          else {
            in_stack_fffffffffffffe07 =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffe07,
                                             CONCAT16(in_stack_fffffffffffffe06,
                                                      CONCAT15(in_stack_fffffffffffffe05,
                                                               CONCAT14(in_stack_fffffffffffffe04,
                                                                        in_stack_fffffffffffffe00)))
                                            ),(char *)in_stack_fffffffffffffdf8);
            if ((bool)in_stack_fffffffffffffe07) {
              std::
              __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b43af);
              in_stack_fffffffffffffe06 =
                   syntactic::ParamSet::getParamBool
                             (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                              (bool)in_stack_fffffffffffffeef);
              peVar2 = std::
                       __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1b43d4);
              peVar2->remapRoughness = (bool)(in_stack_fffffffffffffe06 & 1);
            }
            else {
              in_stack_fffffffffffffe05 =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffe07,
                                               CONCAT16(in_stack_fffffffffffffe06,
                                                        CONCAT15(in_stack_fffffffffffffe05,
                                                                 CONCAT14(in_stack_fffffffffffffe04,
                                                                          in_stack_fffffffffffffe00)
                                                                ))),
                                   (char *)in_stack_fffffffffffffdf8);
              if ((bool)in_stack_fffffffffffffe05) {
                std::
                __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b4414);
                syntactic::ParamSet::getParamTexture
                          (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
                findOrCreateTexture((SemanticParser *)
                                    CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                                    in_RDX);
                std::
                __shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<pbrt::SubstrateMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b4457);
                std::shared_ptr<pbrt::Texture>::operator=
                          ((shared_ptr<pbrt::Texture> *)
                           CONCAT17(in_stack_fffffffffffffe07,
                                    CONCAT16(in_stack_fffffffffffffe06,
                                             CONCAT15(in_stack_fffffffffffffe05,
                                                      CONCAT14(in_stack_fffffffffffffe04,
                                                               in_stack_fffffffffffffe00)))),
                           (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffdf8);
                std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b447b);
                std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                          ((shared_ptr<pbrt::syntactic::Texture> *)0x1b4488);
              }
              else {
                in_stack_fffffffffffffe04 =
                     std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffffe07,
                                                 CONCAT16(in_stack_fffffffffffffe06,
                                                          CONCAT15(in_stack_fffffffffffffe05,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffe04,
                                                  in_stack_fffffffffffffe00)))),
                                     (char *)in_stack_fffffffffffffdf8);
                if (!(bool)in_stack_fffffffffffffe04) {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::operator+(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_RDI);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffe0f,
                                             CONCAT16(in_stack_fffffffffffffe0e,
                                                      CONCAT24(in_stack_fffffffffffffe0c,
                                                               in_stack_fffffffffffffe08))),
                                 (char *)CONCAT17(in_stack_fffffffffffffe07,
                                                  CONCAT16(in_stack_fffffffffffffe06,
                                                           CONCAT15(in_stack_fffffffffffffe05,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffe04,
                                                  in_stack_fffffffffffffe00)))));
                  std::runtime_error::runtime_error(this_00,local_180);
                  __cxa_throw(this_00,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
             *)CONCAT17(in_stack_fffffffffffffe07,
                        CONCAT16(in_stack_fffffffffffffe06,
                                 CONCAT15(in_stack_fffffffffffffe05,
                                          CONCAT14(in_stack_fffffffffffffe04,
                                                   in_stack_fffffffffffffe00)))));
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe07,
                             CONCAT16(in_stack_fffffffffffffe06,
                                      CONCAT15(in_stack_fffffffffffffe05,
                                               CONCAT14(in_stack_fffffffffffffe04,
                                                        in_stack_fffffffffffffe00)))));
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_substrate(pbrt::syntactic::Material::SP in)
  {
    SubstrateMaterial::SP mat = std::make_shared<SubstrateMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kd") {
        if (in->hasParamTexture(name)) {
          mat->kd = vec3f(1.f);
          mat->map_kd = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kd.x,name);
      }
      else if (name == "Ks") {
        if (in->hasParamTexture(name)) {
          mat->ks = vec3f(1.f);
          mat->map_ks = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->ks.x,name);
      }
      else if (name == "uroughness") {
        if (in->hasParamTexture(name)) {
          mat->uRoughness = 1.f;
          mat->map_uRoughness = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->uRoughness = in->getParam1f(name);
      }
      else if (name == "vroughness") {
        if (in->hasParamTexture(name)) {
          mat->vRoughness = 1.f;
          mat->map_vRoughness = findOrCreateTexture(in->getParamTexture(name));
        } else
          mat->vRoughness = in->getParam1f(name);
      }
      else if (name == "remaproughness") {
        mat->remapRoughness = in->getParamBool(name);
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled substrate-material parameter '"+it.first+"'");
    };
    return mat;
  }